

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iadst4_sse2(__m128i *input,__m128i *output)

{
  long lVar1;
  long lVar2;
  __m128i alVar3;
  __m128i alVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int local_a8 [10];
  __m128i x2 [8];
  
  alVar3 = *input;
  alVar4 = input[1];
  auVar16._0_12_ = alVar3._0_12_;
  auVar16._12_2_ = alVar3[0]._6_2_;
  auVar16._14_2_ = *(undefined2 *)((long)input[2] + 6);
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = alVar3._0_10_;
  auVar15._10_2_ = *(undefined2 *)((long)input[2] + 4);
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = alVar3[0];
  auVar14._8_2_ = alVar3[0]._4_2_;
  auVar9._8_8_ = auVar14._8_8_;
  auVar9._6_2_ = *(undefined2 *)((long)input[2] + 2);
  auVar9._4_2_ = alVar3[0]._2_2_;
  auVar9._0_2_ = (undefined2)alVar3[0];
  auVar9._2_2_ = (short)input[2][0];
  auVar7._2_2_ = (short)input[2][1];
  auVar7._0_2_ = (short)alVar3[1];
  auVar7._4_2_ = alVar3[1]._2_2_;
  auVar7._6_2_ = *(undefined2 *)((long)input[2] + 10);
  auVar7._8_2_ = alVar3[1]._4_2_;
  auVar7._10_2_ = *(undefined2 *)((long)input[2] + 0xc);
  auVar7._12_2_ = alVar3[1]._6_2_;
  auVar7._14_2_ = *(undefined2 *)((long)input[2] + 0xe);
  auVar13._0_12_ = alVar4._0_12_;
  auVar13._12_2_ = alVar4[0]._6_2_;
  auVar13._14_2_ = *(undefined2 *)((long)input[3] + 6);
  auVar12._12_4_ = auVar13._12_4_;
  auVar12._0_10_ = alVar4._0_10_;
  auVar12._10_2_ = *(undefined2 *)((long)input[3] + 4);
  auVar10._10_6_ = auVar12._10_6_;
  auVar10._0_8_ = alVar4[0];
  auVar10._8_2_ = alVar4[0]._4_2_;
  auVar8._8_8_ = auVar10._8_8_;
  auVar8._6_2_ = *(undefined2 *)((long)input[3] + 2);
  auVar8._4_2_ = alVar4[0]._2_2_;
  auVar8._0_2_ = (undefined2)alVar4[0];
  auVar8._2_2_ = (short)input[3][0];
  auVar6._2_2_ = (short)input[3][1];
  auVar6._0_2_ = (short)alVar4[1];
  auVar6._4_2_ = alVar4[1]._2_2_;
  auVar6._6_2_ = *(undefined2 *)((long)input[3] + 10);
  auVar6._8_2_ = alVar4[1]._4_2_;
  auVar6._10_2_ = *(undefined2 *)((long)input[3] + 0xc);
  auVar6._12_2_ = alVar4[1]._6_2_;
  auVar6._14_2_ = *(undefined2 *)((long)input[3] + 0xe);
  auVar19._8_4_ = 0xedb0529;
  auVar19._0_8_ = 0xedb05290edb0529;
  auVar19._12_4_ = 0xedb0529;
  auVar17 = pmaddwd(auVar9,auVar19);
  auVar15 = pmaddwd(auVar19,auVar7);
  auVar24._8_4_ = 0xfad709b2;
  auVar24._0_8_ = 0xfad709b2fad709b2;
  auVar24._12_4_ = 0xfad709b2;
  auVar23 = pmaddwd(auVar9,auVar24);
  auVar19 = pmaddwd(auVar24,auVar7);
  auVar18._8_4_ = 0x9b20d10;
  auVar18._0_8_ = 0x9b20d1009b20d10;
  auVar18._12_4_ = 0x9b20d10;
  auVar14 = pmaddwd(auVar8,auVar18);
  auVar13 = pmaddwd(auVar18,auVar6);
  auVar20._8_4_ = 0xf1250d10;
  auVar20._0_8_ = 0xf1250d10f1250d10;
  auVar20._12_4_ = 0xf1250d10;
  auVar18 = pmaddwd(auVar8,auVar20);
  auVar16 = pmaddwd(auVar20,auVar6);
  auVar25._8_4_ = 0xf2f00d10;
  auVar25._0_8_ = 0xf2f00d10f2f00d10;
  auVar25._12_4_ = 0xf2f00d10;
  auVar24 = pmaddwd(auVar9,auVar25);
  auVar20 = pmaddwd(auVar25,auVar7);
  auVar11._8_4_ = 0xd100000;
  auVar11._0_8_ = 0xd1000000d100000;
  auVar11._12_4_ = 0xd100000;
  auVar25 = pmaddwd(auVar8,auVar11);
  auVar12 = pmaddwd(auVar11,auVar6);
  auVar21._8_4_ = 0x9b20edb;
  auVar21._0_8_ = 0x9b20edb09b20edb;
  auVar21._12_4_ = 0x9b20edb;
  auVar10 = pmaddwd(auVar9,auVar21);
  auVar7 = pmaddwd(auVar7,auVar21);
  auVar22._8_4_ = 0xfad7f2f0;
  auVar22._0_8_ = 0xfad7f2f0fad7f2f0;
  auVar22._12_4_ = 0xfad7f2f0;
  auVar8 = pmaddwd(auVar8,auVar22);
  auVar6 = pmaddwd(auVar6,auVar22);
  local_a8[0] = auVar14._0_4_ + auVar17._0_4_;
  local_a8[1] = auVar14._4_4_ + auVar17._4_4_;
  local_a8[2] = auVar14._8_4_ + auVar17._8_4_;
  local_a8[3] = auVar14._12_4_ + auVar17._12_4_;
  local_a8[4] = auVar13._0_4_ + auVar15._0_4_;
  local_a8[5] = auVar13._4_4_ + auVar15._4_4_;
  local_a8[6] = auVar13._8_4_ + auVar15._8_4_;
  local_a8[7] = auVar13._12_4_ + auVar15._12_4_;
  local_a8[8] = auVar18._0_4_ + auVar23._0_4_;
  local_a8[9] = auVar18._4_4_ + auVar23._4_4_;
  x2[0][0]._0_4_ = auVar18._8_4_ + auVar23._8_4_;
  x2[0][0]._4_4_ = auVar18._12_4_ + auVar23._12_4_;
  x2[0][1]._0_4_ = auVar16._0_4_ + auVar19._0_4_;
  x2[0][1]._4_4_ = auVar16._4_4_ + auVar19._4_4_;
  x2[1][0]._0_4_ = auVar16._8_4_ + auVar19._8_4_;
  x2[1][0]._4_4_ = auVar16._12_4_ + auVar19._12_4_;
  x2[1][1]._0_4_ = auVar25._0_4_ + auVar24._0_4_;
  x2[1][1]._4_4_ = auVar25._4_4_ + auVar24._4_4_;
  x2[2][0]._0_4_ = auVar25._8_4_ + auVar24._8_4_;
  x2[2][0]._4_4_ = auVar25._12_4_ + auVar24._12_4_;
  x2[2][1]._0_4_ = auVar12._0_4_ + auVar20._0_4_;
  x2[2][1]._4_4_ = auVar12._4_4_ + auVar20._4_4_;
  x2[3][0]._0_4_ = auVar12._8_4_ + auVar20._8_4_;
  x2[3][0]._4_4_ = auVar12._12_4_ + auVar20._12_4_;
  x2[3][1]._0_4_ = auVar8._0_4_ + auVar10._0_4_;
  x2[3][1]._4_4_ = auVar8._4_4_ + auVar10._4_4_;
  x2[4][0]._0_4_ = auVar8._8_4_ + auVar10._8_4_;
  x2[4][0]._4_4_ = auVar8._12_4_ + auVar10._12_4_;
  x2[4][1]._0_4_ = auVar6._0_4_ + auVar7._0_4_;
  x2[4][1]._4_4_ = auVar6._4_4_ + auVar7._4_4_;
  x2[5][0]._0_4_ = auVar6._8_4_ + auVar7._8_4_;
  x2[5][0]._4_4_ = auVar6._12_4_ + auVar7._12_4_;
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 0x10) {
    lVar1 = lVar5 * 2;
    lVar2 = lVar5 * 2;
    auVar17._0_4_ = *(int *)((long)local_a8 + lVar1) + 0x800 >> 0xc;
    auVar17._4_4_ = *(int *)((long)local_a8 + lVar1 + 4) + 0x800 >> 0xc;
    auVar17._8_4_ = *(int *)((long)local_a8 + lVar1 + 8) + 0x800 >> 0xc;
    auVar17._12_4_ = *(int *)((long)local_a8 + lVar1 + 0xc) + 0x800 >> 0xc;
    auVar23._0_4_ = *(int *)((long)local_a8 + lVar2 + 0x10) + 0x800 >> 0xc;
    auVar23._4_4_ = *(int *)((long)local_a8 + lVar2 + 0x14) + 0x800 >> 0xc;
    auVar23._8_4_ = *(int *)((long)x2[-1] + lVar2) + 0x800 >> 0xc;
    auVar23._12_4_ = *(int *)((long)x2[-1] + lVar2 + 4) + 0x800 >> 0xc;
    auVar6 = packssdw(auVar17,auVar23);
    *(undefined1 (*) [16])((long)*output + lVar5) = auVar6;
  }
  return;
}

Assistant:

static void iadst4_sse2(const __m128i *input, __m128i *output) {
  const int32_t *sinpi = sinpi_arr(INV_COS_BIT);
  const __m128i sinpi_p01_p04 = pair_set_epi16(sinpi[1], sinpi[4]);
  const __m128i sinpi_p02_m01 = pair_set_epi16(sinpi[2], -sinpi[1]);
  const __m128i sinpi_p03_p02 = pair_set_epi16(sinpi[3], sinpi[2]);
  const __m128i sinpi_p03_m04 = pair_set_epi16(sinpi[3], -sinpi[4]);
  const __m128i sinpi_p03_m03 = pair_set_epi16(sinpi[3], -sinpi[3]);
  const __m128i sinpi_0_p03 = pair_set_epi16(0, sinpi[3]);
  const __m128i sinpi_p04_p02 = pair_set_epi16(sinpi[4], sinpi[2]);
  const __m128i sinpi_m03_m01 = pair_set_epi16(-sinpi[3], -sinpi[1]);
  __m128i x0[4];
  x0[0] = input[0];
  x0[1] = input[1];
  x0[2] = input[2];
  x0[3] = input[3];

  __m128i u[4];
  u[0] = _mm_unpacklo_epi16(x0[0], x0[2]);
  u[1] = _mm_unpackhi_epi16(x0[0], x0[2]);
  u[2] = _mm_unpacklo_epi16(x0[1], x0[3]);
  u[3] = _mm_unpackhi_epi16(x0[1], x0[3]);

  __m128i x1[16];
  x1[0] = _mm_madd_epi16(u[0], sinpi_p01_p04);  // x0*sin1 + x2*sin4
  x1[1] = _mm_madd_epi16(u[1], sinpi_p01_p04);
  x1[2] = _mm_madd_epi16(u[0], sinpi_p02_m01);  // x0*sin2 - x2*sin1
  x1[3] = _mm_madd_epi16(u[1], sinpi_p02_m01);
  x1[4] = _mm_madd_epi16(u[2], sinpi_p03_p02);  // x1*sin3 + x3*sin2
  x1[5] = _mm_madd_epi16(u[3], sinpi_p03_p02);
  x1[6] = _mm_madd_epi16(u[2], sinpi_p03_m04);  // x1*sin3 - x3*sin4
  x1[7] = _mm_madd_epi16(u[3], sinpi_p03_m04);
  x1[8] = _mm_madd_epi16(u[0], sinpi_p03_m03);  // x0*sin3 - x2*sin3
  x1[9] = _mm_madd_epi16(u[1], sinpi_p03_m03);
  x1[10] = _mm_madd_epi16(u[2], sinpi_0_p03);  // x2*sin3
  x1[11] = _mm_madd_epi16(u[3], sinpi_0_p03);
  x1[12] = _mm_madd_epi16(u[0], sinpi_p04_p02);  // x0*sin4 + x2*sin2
  x1[13] = _mm_madd_epi16(u[1], sinpi_p04_p02);
  x1[14] = _mm_madd_epi16(u[2], sinpi_m03_m01);  // -x1*sin3 - x3*sin1
  x1[15] = _mm_madd_epi16(u[3], sinpi_m03_m01);

  __m128i x2[8];
  x2[0] = _mm_add_epi32(x1[0], x1[4]);  // x0*sin1 +x2*sin4 +x1*sin3 +x3*sin2
  x2[1] = _mm_add_epi32(x1[1], x1[5]);
  x2[2] = _mm_add_epi32(x1[2], x1[6]);  // x0*sin2 -x2*sin1 +x1*sin3 -x3*sin4
  x2[3] = _mm_add_epi32(x1[3], x1[7]);
  x2[4] = _mm_add_epi32(x1[8], x1[10]);  // x0*sin3 -x2*sin3 +x3*sin3
  x2[5] = _mm_add_epi32(x1[9], x1[11]);
  x2[6] = _mm_add_epi32(x1[12], x1[14]);  // x0*sin1 +x2*sin4 +x0*sin2 -x2*sin1
  x2[7] = _mm_add_epi32(x1[13], x1[15]);

  const __m128i rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  for (int i = 0; i < 4; ++i) {
    __m128i out0 = _mm_add_epi32(x2[2 * i], rounding);
    __m128i out1 = _mm_add_epi32(x2[2 * i + 1], rounding);
    out0 = _mm_srai_epi32(out0, INV_COS_BIT);
    out1 = _mm_srai_epi32(out1, INV_COS_BIT);
    output[i] = _mm_packs_epi32(out0, out1);
  }
}